

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O0

void __thiscall HTML::TAG::TAG(TAG *this,string *tag,ostream *stream)

{
  ostream *poVar1;
  ostream *stream_local;
  string *tag_local;
  TAG *this_local;
  
  this->_vptr_TAG = (_func_int **)&PTR__TAG_0032fd50;
  std::__cxx11::string::string((string *)&this->m_tag,(string *)tag);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_value);
  this->m_stream = stream;
  poVar1 = std::operator<<(this->m_stream,"<");
  std::operator<<(poVar1,(string *)&this->m_tag);
  return;
}

Assistant:

TAG(const std::string &tag, std::ostream &stream)
      : m_tag(tag),
        m_stream(stream) {
    m_stream << "<" << m_tag;
  }